

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktWsiTests.cpp
# Opt level: O2

void vkt::wsi::anon_unknown_1::createWsiTests(TestCaseGroup *apiTests)

{
  char *__s;
  Type wsiType;
  allocator<char> local_72;
  allocator<char> local_71;
  string local_70;
  string local_50;
  
  for (wsiType = TYPE_XLIB; wsiType != TYPE_LAST; wsiType = wsiType + TYPE_XCB) {
    __s = ::vk::wsi::getName(wsiType);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_71);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_72);
    addTestGroup<vk::wsi::Type>(apiTests,&local_50,&local_70,createTypeSpecificTests,wsiType);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void createWsiTests (tcu::TestCaseGroup* apiTests)
{
	for (int typeNdx = 0; typeNdx < vk::wsi::TYPE_LAST; ++typeNdx)
	{
		const vk::wsi::Type	wsiType	= (vk::wsi::Type)typeNdx;

		addTestGroup(apiTests, getName(wsiType), "", createTypeSpecificTests, wsiType);
	}
}